

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteSpherical.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkRevoluteSpherical::IntLoadConstraint_C
          (ChLinkRevoluteSpherical *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  Scalar *pSVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  undefined8 in_XMM1_Qb;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  iVar3 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar3 != '\0') {
    dVar7 = (this->m_cur_dist - this->m_dist) * c;
    if (do_clamp) {
      auVar2._8_8_ = in_XMM1_Qb;
      auVar2._0_8_ = recovery_clamp;
      auVar1._8_8_ = 0x8000000000000000;
      auVar1._0_8_ = 0x8000000000000000;
      auVar5 = vxorpd_avx512vl(auVar2,auVar1);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = dVar7;
      auVar1 = vmaxsd_avx(auVar8,auVar5);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = c * this->m_cur_dot;
      auVar5 = vmaxsd_avx(auVar9,auVar5);
      auVar1 = vminsd_avx(auVar1,auVar2);
      dVar7 = auVar1._0_8_;
      auVar1 = vminsd_avx(auVar5,auVar2);
      dVar6 = auVar1._0_8_;
    }
    else {
      dVar6 = c * this->m_cur_dot;
    }
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                        (ulong)off_L);
    *pSVar4 = dVar7 + *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                        (ulong)(off_L + 1));
    *pSVar4 = dVar6 + *pSVar4;
  }
  return;
}

Assistant:

void ChLinkRevoluteSpherical::IntLoadConstraint_C(const unsigned int off_L,  ///< offset in Qc residual
                                                  ChVectorDynamic<>& Qc,     ///< result: the Qc residual, Qc += c*C
                                                  const double c,            ///< a scaling factor
                                                  bool do_clamp,             ///< apply clamping to c*C?
                                                  double recovery_clamp      ///< value for min/max clamping of c*C
                                                  ) {
    if (!IsActive())
        return;

    double cnstr_dist_violation =
        do_clamp ? ChMin(ChMax(c * (m_cur_dist - m_dist), -recovery_clamp), recovery_clamp) : c * (m_cur_dist - m_dist);

    double cnstr_dot_violation =
        do_clamp ? ChMin(ChMax(c * m_cur_dot, -recovery_clamp), recovery_clamp) : c * m_cur_dot;

    Qc(off_L + 0) += cnstr_dist_violation;
    Qc(off_L + 1) += cnstr_dot_violation;
}